

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_CHARACTER::Load
          (_Type_CHARACTER *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Memory *this_00;
  Character *this_01;
  uint index;
  uint id;
  Object *pOVar1;
  long in_R8;
  long *plVar2;
  Variable V;
  Nullable<LiteScript::Variable> local_50;
  
  index = IStreamer::Read<unsigned_int>(stream);
  this_00 = object->memory;
  plVar2 = (long *)((long)(this_00->arr)._M_elems + in_R8);
  if ((caller & 1) != 0) {
    caller = *(undefined8 *)(*plVar2 + -1 + caller);
  }
  id = (*(code *)caller)(plVar2,stream);
  Memory::GetVariable(&local_50,this_00,id);
  Variable::Variable(&V,(Variable *)&local_50);
  Nullable<LiteScript::Variable>::Nullify(&local_50);
  Object::Reassign(object,(Type *)_type_character,0x38);
  this_01 = (Character *)object->data;
  pOVar1 = Variable::operator->(&V);
  Character::Character(this_01,(String *)pOVar1->data,index);
  Nullable<LiteScript::Variable>::operator=
            ((Nullable<LiteScript::Variable> *)((long)object->data + 0x10),&V);
  Variable::~Variable(&V);
  return;
}

Assistant:

void LiteScript::_Type_CHARACTER::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    unsigned int index = IStreamer::Read<unsigned int>(stream);
    Variable V = *object.memory.GetVariable((object.memory.*caller)(stream));
    object.Reassign(_type_character, sizeof(Character));
    std::allocator<Character> allocator;
    allocator.construct(&object.GetData<Character>(), V->GetData<String>(), index);
    object.GetData<Character>().obj_string = V;
}